

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui4.cpp
# Opt level: O0

ssize_t __thiscall DomResources::write(DomResources *this,int __fd,void *__buf,size_t __n)

{
  bool bVar1;
  DomResource **ppDVar2;
  size_t __n_00;
  undefined4 in_register_00000034;
  QString *pQVar3;
  long in_FS_OFFSET;
  DomResource *v;
  QList<DomResource_*> *__range1;
  char16_t *str;
  const_iterator __end1;
  const_iterator __begin1;
  DomResources *in_stack_fffffffffffffec8;
  DomResource *this_00;
  QArrayDataPointer<char16_t> *in_stack_fffffffffffffed0;
  QString *pQVar4;
  QString *in_stack_fffffffffffffed8;
  QString *str_00;
  undefined1 local_c8 [24];
  DomResource **local_b0;
  const_iterator local_a8;
  const_iterator local_a0 [9];
  QAnyStringView *local_58;
  QArrayDataPointer<char16_t> local_48 [2];
  long local_8;
  
  pQVar3 = (QString *)CONCAT44(in_register_00000034,__fd);
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  str_00 = pQVar3;
  bVar1 = QString::isEmpty((QString *)0x1a2819);
  if (bVar1) {
    QArrayDataPointer<char16_t>::QArrayDataPointer(local_48,(Data *)0x0,L"resources",9);
    QString::QString((QString *)in_stack_fffffffffffffed0,(DataPointer *)in_stack_fffffffffffffec8);
  }
  else {
    QString::toLower(&in_stack_fffffffffffffec8->m_attr_name);
  }
  QAnyStringView::QAnyStringView((QAnyStringView *)this,in_stack_fffffffffffffed8);
  QXmlStreamWriter::writeStartElement((QAnyStringView *)str_00);
  QString::~QString((QString *)0x1a28cc);
  if (bVar1) {
    QArrayDataPointer<char16_t>::~QArrayDataPointer(in_stack_fffffffffffffed0);
  }
  bVar1 = hasAttributeName(this);
  if (bVar1) {
    pQVar4 = pQVar3;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,pQVar4);
    attributeName(in_stack_fffffffffffffec8);
    QAnyStringView::QAnyStringView((QAnyStringView *)this,pQVar4);
    QXmlStreamWriter::writeAttribute((QAnyStringView *)pQVar4,local_58);
    QString::~QString((QString *)0x1a298b);
    QString::~QString((QString *)0x1a2998);
  }
  __n_00 = 0xaaaaaaaaaaaaaaaa;
  local_a0[0].i = (DomResource **)0xaaaaaaaaaaaaaaaa;
  local_a0[0] = QList<DomResource_*>::begin((QList<DomResource_*> *)in_stack_fffffffffffffed0);
  local_a8.i = (DomResource **)0xaaaaaaaaaaaaaaaa;
  local_a8 = QList<DomResource_*>::end((QList<DomResource_*> *)in_stack_fffffffffffffed0);
  while( true ) {
    local_b0 = local_a8.i;
    bVar1 = QList<DomResource_*>::const_iterator::operator!=(local_a0,local_a8);
    if (!bVar1) break;
    ppDVar2 = QList<DomResource_*>::const_iterator::operator*(local_a0);
    this_00 = *ppDVar2;
    pQVar4 = pQVar3;
    Qt::Literals::StringLiterals::operator____s((char16_t *)str_00,(size_t)this);
    DomResource::write(this_00,(int)pQVar4,local_c8,__n_00);
    QString::~QString((QString *)0x1a2a7d);
    QList<DomResource_*>::const_iterator::operator++(local_a0);
  }
  QXmlStreamWriter::writeEndElement();
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return *(long *)(in_FS_OFFSET + 0x28);
}

Assistant:

void DomResources::write(QXmlStreamWriter &writer, const QString &tagName) const
{
    writer.writeStartElement(tagName.isEmpty() ? QStringLiteral("resources") : tagName.toLower());

    if (hasAttributeName())
        writer.writeAttribute(u"name"_s, attributeName());

    for (DomResource *v : m_include)
        v->write(writer, u"include"_s);

    writer.writeEndElement();
}